

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_PerObjectMeshParameters * __thiscall
ON_PerObjectMeshParameters::Duplicate(ON_PerObjectMeshParameters *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_PerObjectMeshParameters *this_local;
  
  iVar1 = (*(this->super_ON_UserData).super_ON_Object._vptr_ON_Object[2])();
  return (ON_PerObjectMeshParameters *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ON_PerObjectMeshParameters* ON_PerObjectMeshParameters::FindOrCreate(const ON_Object* object,bool bCreate)
{
  if ( 0 == object )
    return 0;
  ON_PerObjectMeshParameters* ud = ON_PerObjectMeshParameters::Cast(object->GetUserData(ON_CLASS_ID(ON_PerObjectMeshParameters)));
  if ( !ud && bCreate )
  {
    ud = new ON_PerObjectMeshParameters();
    const_cast< ON_Object* >(object)->AttachUserData(ud);
  }
  return ud;
}